

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall
QTipLabel::QTipLabel(QTipLabel *this,QString *text,QPoint *pos,QWidget *w,int msecDisplayTime)

{
  int iVar1;
  QPalette *pQVar2;
  QStyle *pQVar3;
  QTipLabel *this_00;
  long in_FS_OFFSET;
  QPalette local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::QLabel(&this->super_QLabel,w,(WindowFlags)0x2000000d);
  *(undefined ***)&(this->super_QLabel).super_QFrame.super_QWidget = &PTR_metaObject_007eca48;
  *(undefined ***)&(this->super_QLabel).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTipLabel_007ecc00;
  (this->hideTimer).m_id = Invalid;
  (this->expireTimer).m_id = Invalid;
  this->styleSheetParent = (QWidget *)0x0;
  this->widget = (QWidget *)0x0;
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  if (instance != (QTipLabel *)0x0) {
    (**(code **)(*(long *)&(instance->super_QLabel).super_QFrame.super_QWidget + 0x20))();
  }
  instance = this;
  QWidget::setForegroundRole((QWidget *)this,ToolTipText);
  this_00 = this;
  QWidget::setBackgroundRole((QWidget *)this,ToolTipBase);
  pQVar2 = (QPalette *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tooltip_palette>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tooltip_palette>_>
                       *)this_00);
  QPalette::QPalette(&local_40,pQVar2);
  QWidget::setPalette((QWidget *)this,&local_40);
  QPalette::~QPalette(&local_40);
  QWidget::ensurePolished((QWidget *)this);
  pQVar3 = QWidget::style((QWidget *)this);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x42,0,this);
  QLabel::setMargin(&this->super_QLabel,iVar1 + 1);
  QFrame::setFrameStyle((QFrame *)this,0);
  QLabel::setAlignment(&this->super_QLabel,(Alignment)0x1);
  QLabel::setIndent(&this->super_QLabel,1);
  QObject::installEventFilter(QCoreApplication::self);
  pQVar3 = QWidget::style((QWidget *)this);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x2e,0,this,0);
  QWidget::setWindowOpacity((QWidget *)this,(double)iVar1 / 255.0);
  QWidget::setAttribute((QWidget *)this,WA_MouseTracking,true);
  this->fadingOut = false;
  reuseTip(this,text,msecDisplayTime,pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTipLabel::QTipLabel(const QString &text, const QPoint &pos, QWidget *w, int msecDisplayTime)
    : QLabel(w, Qt::ToolTip | Qt::BypassGraphicsProxyWidget)
#ifndef QT_NO_STYLE_STYLESHEET
    , styleSheetParent(nullptr)
#endif
    , widget(nullptr)
{
    delete instance;
    instance = this;
    setForegroundRole(QPalette::ToolTipText);
    setBackgroundRole(QPalette::ToolTipBase);
    setPalette(QToolTip::palette());
    ensurePolished();
    setMargin(1 + style()->pixelMetric(QStyle::PM_ToolTipLabelFrameWidth, nullptr, this));
    setFrameStyle(QFrame::NoFrame);
    setAlignment(Qt::AlignLeft);
    setIndent(1);
    qApp->installEventFilter(this);
    setWindowOpacity(style()->styleHint(QStyle::SH_ToolTipLabel_Opacity, nullptr, this) / 255.0);
    setMouseTracking(true);
    fadingOut = false;
    reuseTip(text, msecDisplayTime, pos);
}